

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

void __thiscall correctness_div_long_signed2_Test::TestBody(correctness_div_long_signed2_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  big_integer c;
  big_integer b;
  big_integer a;
  AssertHelper local_1a0;
  internal local_198 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  string local_188;
  string local_168;
  string local_148;
  long *local_128 [7];
  big_integer local_f0;
  big_integer local_b8;
  big_integer local_80;
  big_integer local_48;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "-10000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,"");
  big_integer::big_integer(&local_48,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"-100000000000000000000000000000000000000","");
  big_integer::big_integer(&local_80,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"100000000000000000000000000000000000000000000000000000","");
  big_integer::big_integer(&local_b8,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  big_integer::big_integer(&local_f0,&local_48);
  operator/((big_integer *)local_128,&local_f0,&local_80);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            (local_198,"a / b","c",(big_integer *)local_128,&local_b8);
  big_integer::~big_integer((big_integer *)local_128);
  big_integer::~big_integer(&local_f0);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_190.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_190.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x234,message);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128[0] !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*local_128[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  big_integer::~big_integer(&local_b8);
  big_integer::~big_integer(&local_80);
  big_integer::~big_integer(&local_48);
  return;
}

Assistant:

TEST(correctness, mul_return_value)
{
    big_integer a = 5;
    big_integer b = 2;

    (a *= b) *= b;
    EXPECT_EQ(a, 20);
}